

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalTexture1DArrayGradOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  undefined1 local_28 [8];
  float fStack_20;
  float fStack_1c;
  
  fVar1 = c->in[0].m_data[0];
  fVar7 = (float)(c->textures[0].tex1DArray)->m_width;
  fVar2 = c->in[0].m_data[1];
  fVar8 = fVar7 * c->in[1].m_data[0];
  fVar7 = fVar7 * c->in[2].m_data[0];
  uVar5 = -(uint)(-fVar8 <= fVar8);
  uVar6 = -(uint)(-fVar7 <= fVar7);
  fVar8 = (float)(~uVar5 & (uint)-fVar8 | (uint)fVar8 & uVar5);
  fVar7 = (float)(~uVar6 & (uint)-fVar7 | (uint)fVar7 & uVar6);
  uVar5 = -(uint)(fVar7 <= fVar8);
  fVar7 = logf((float)(~uVar5 & (uint)fVar7 | (uint)fVar8 & uVar5));
  tcu::Texture1DArrayView::sampleOffset
            ((Texture1DArrayView *)local_28,(Sampler *)&(c->textures[0].tex1DArray)->m_view,fVar1,
             fVar2,fVar7 * 1.442695,(int)c + 0x70);
  fVar1 = (p->scale).m_data[1];
  fVar2 = (p->scale).m_data[2];
  fVar7 = (p->scale).m_data[3];
  fVar8 = (p->bias).m_data[1];
  fVar3 = (p->bias).m_data[2];
  fVar4 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * (float)local_28._0_4_ + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar1 * (float)local_28._4_4_ + fVar8;
  (c->color).m_data[2] = fVar2 * fStack_20 + fVar3;
  (c->color).m_data[3] = fVar7 * fStack_1c + fVar4;
  return;
}

Assistant:

static void		evalTexture1DArrayGradOffset	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture1DArrayOffset(c, c.in[0].x(), c.in[0].y(), computeLodFromGrad1DArray(c), p.offset.x())*p.scale + p.bias; }